

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

void __thiscall DomString::~DomString(DomString *this)

{
  QString::~QString((QString *)0x1c0170);
  QString::~QString((QString *)0x1c017e);
  QString::~QString((QString *)0x1c018c);
  QString::~QString((QString *)0x1c019a);
  QString::~QString((QString *)0x1c01a4);
  return;
}

Assistant:

DomString::~DomString() = default;